

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  Config *this_local;
  
  (this->super_IConfig).super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__Config_0028c410;
  TestSpec::~TestSpec(&this->m_testSpec);
  clara::std::unique_ptr<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>::
  ~unique_ptr(&this->m_stream);
  ConfigData::~ConfigData(&this->m_data);
  IConfig::~IConfig(&this->super_IConfig);
  return;
}

Assistant:

virtual ~Config() = default;